

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable
          (HashSetResizeHelper *this,CommonFields *c,size_t slot_size)

{
  bool bVar1;
  size_t sVar2;
  size_t new_capacity;
  ctrl_t *new_ctrl;
  void *new_slots;
  size_t slot_size_local;
  CommonFields *c_local;
  HashSetResizeHelper *this_local;
  
  if (7 < this->old_capacity_) {
    __assert_fail("old_capacity_ < Group::kWidth / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x1f7,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable(CommonFields &, size_t)"
                 );
  }
  sVar2 = CommonFields::capacity(c);
  bVar1 = is_single_group(sVar2);
  if (!bVar1) {
    __assert_fail("is_single_group(c.capacity())",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x1f8,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable(CommonFields &, size_t)"
                 );
  }
  sVar2 = this->old_capacity_;
  new_capacity = CommonFields::capacity(c);
  bVar1 = IsGrowingIntoSingleGroupApplicable(sVar2,new_capacity);
  if (!bVar1) {
    __assert_fail("IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x1f9,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable(CommonFields &, size_t)"
                 );
  }
  new_ctrl = CommonFields::control(c);
  sVar2 = CommonFields::capacity(c);
  GrowIntoSingleGroupShuffleControlBytes(this,new_ctrl,sVar2);
  new_slots = CommonFields::slot_array(c);
  GrowIntoSingleGroupShuffleTransferableSlots(this,new_slots,slot_size);
  PoisonSingleGroupEmptySlots(this,c,slot_size);
  return;
}

Assistant:

void HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable(
    CommonFields& c, size_t slot_size) {
  assert(old_capacity_ < Group::kWidth / 2);
  assert(is_single_group(c.capacity()));
  assert(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));

  GrowIntoSingleGroupShuffleControlBytes(c.control(), c.capacity());
  GrowIntoSingleGroupShuffleTransferableSlots(c.slot_array(), slot_size);

  // We poison since GrowIntoSingleGroupShuffleTransferableSlots
  // may leave empty slots unpoisoned.
  PoisonSingleGroupEmptySlots(c, slot_size);
}